

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios_iotest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  key_type *__k;
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  pointer psVar6;
  pointer ppVar7;
  int iVar8;
  _Rb_tree_color _Var9;
  size_t i;
  ostream *poVar10;
  long lVar11;
  mapped_type *pmVar12;
  iterator iVar13;
  _Base_ptr this;
  iterator iVar14;
  __shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2> *p_Var15;
  pointer psVar16;
  mapped_type *pmVar17;
  iterator iVar18;
  long lVar19;
  void *pvVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  size_t c;
  ulong uVar24;
  _Base_ptr p_Var25;
  element_type *peVar26;
  char *pcVar27;
  char cVar28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
  *st;
  pointer ppVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  long local_668;
  ulong local_658;
  string streamName;
  ADIOS adios;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_620;
  int argc_local;
  size_t currentConfigLineNumber;
  shared_ptr<Stream> writer;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
  ioMap;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
  streamsInOrder;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  readStreamMap;
  shared_ptr<ioGroup> io;
  char **argv_local;
  int provided;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  __shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> local_518;
  __shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> local_508;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  writeStreamMap;
  Config cfg;
  Settings settings;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  groupMap;
  
  argc_local = argc;
  argv_local = argv;
  Settings::Settings(&settings);
  iVar8 = Settings::processArguments(&settings,argc,argv);
  if (iVar8 == 0) {
    MPI_Init_thread(&argc_local,&argv_local,
                    (uint)settings.multithreadedMPI + (uint)settings.multithreadedMPI * 2,&provided)
    ;
    Settings::initDecomp(&settings,(MPI_Comm)&ompi_mpi_comm_world);
    iVar8 = Settings::extraArgumentChecks(&settings);
    if (iVar8 == 0) {
      adios2::ADIOS::ADIOS(&adios);
      if (settings.adiosConfigFileName._M_string_length == 0) {
        if (settings.verbose != 0 && settings.myRank == 0) {
          poVar10 = std::operator<<((ostream *)&std::cout,"Use ADIOS without XML configuration ");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        adios2::ADIOS::ADIOS((ADIOS *)&cfg,settings.appComm);
      }
      else {
        if (settings.verbose != 0 && settings.myRank == 0) {
          poVar10 = std::operator<<((ostream *)&std::cout,"Use ADIOS xml file ");
          poVar10 = std::operator<<(poVar10,(string *)&settings.adiosConfigFileName);
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        adios2::ADIOS::ADIOS((ADIOS *)&cfg,(string *)&settings.adiosConfigFileName,settings.appComm)
        ;
      }
      std::__shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2> *)&adios,
                 (__shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2> *)&cfg);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cfg.stepOverStreams);
      cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_header;
      cfg.nSteps = 1;
      cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_header;
      cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_header;
      cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_header;
      cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cfg.commands.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      cfg.commands.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cfg.commands.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      currentConfigLineNumber = 0;
      cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cfg.groupVariableListMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cfg.groupVariablesMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cfg.condMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      processConfig((Config *)&groupMap,&settings,&currentConfigLineNumber);
      Config::operator=(&cfg,(Config *)&groupMap);
      Config::~Config((Config *)&groupMap);
      MPI_Barrier(settings.appComm);
      dVar4 = (double)MPI_Wtime();
      if ((settings.myRank == 0) && (settings.verbose != 0)) {
        std::__cxx11::to_string((string *)&readStreamMap,settings.appId);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ioMap,
                       "Start App ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &readStreamMap);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &groupMap,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ioMap,
                       ": ");
        poVar10 = std::operator<<((ostream *)&std::cout,(string *)&groupMap);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::string::~string((string *)&groupMap);
        std::__cxx11::string::~string((string *)&ioMap);
        std::__cxx11::string::~string((string *)&readStreamMap);
      }
      psVar6 = cfg.commands.
               super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &groupMap._M_t._M_impl.super__Rb_tree_header._M_header;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      streamsInOrder.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      streamsInOrder.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      streamsInOrder.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (psVar16 = cfg.commands.
                     super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar7 = streamsInOrder.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, psVar16 != psVar6;
          psVar16 = psVar16 + 1) {
        peVar26 = (psVar16->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar26->op == Read) {
          lVar11 = __dynamic_cast(peVar26,&Command::typeinfo,&CommandRead::typeinfo,0);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&groupMap,(key_type *)(lVar11 + 0x38));
          std::__cxx11::string::_M_assign((string *)pmVar12);
          std::__cxx11::string::string((string *)&ioMap,(string *)(lVar11 + 0x38));
          ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)
               CONCAT44(ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,3);
          std::
          vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
          ::emplace_back<std::pair<std::__cxx11::string,Operation>>
                    ((vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
                      *)&streamsInOrder,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                      *)&ioMap);
LAB_00114f52:
          std::__cxx11::string::~string((string *)&ioMap);
        }
        else if (peVar26->op == Write) {
          lVar11 = __dynamic_cast(peVar26,&Command::typeinfo,&CommandWrite::typeinfo,0);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&groupMap,(key_type *)(lVar11 + 0x30));
          std::__cxx11::string::_M_assign((string *)pmVar12);
          std::__cxx11::string::string((string *)&ioMap,(string *)(lVar11 + 0x30));
          ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)
               CONCAT44(ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,2);
          std::
          vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
          ::emplace_back<std::pair<std::__cxx11::string,Operation>>
                    ((vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
                      *)&streamsInOrder,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                      *)&ioMap);
          goto LAB_00114f52;
        }
      }
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &ioMap._M_t._M_impl.super__Rb_tree_header._M_header;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (ppVar29 = streamsInOrder.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar29 != ppVar7;
          ppVar29 = ppVar29 + 1) {
        std::__cxx11::string::string((string *)&streamName,(string *)ppVar29);
        io.super___shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        io.super___shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&groupMap,&streamName);
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                 ::find(&ioMap._M_t,pmVar12);
        if ((_Rb_tree_header *)iVar13._M_node == &ioMap._M_t._M_impl.super__Rb_tree_header) {
          createGroup((string *)&writer,(IOLib)pmVar12,(ADIOS *)(ulong)settings.iolib);
          std::__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> *)&io,
                     (__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> *)&writer);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          this = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                 ::operator[](&ioMap,pmVar12);
          p_Var25 = (_Base_ptr)&io;
        }
        else {
          p_Var25 = iVar13._M_node + 2;
          this = (_Base_ptr)&io;
        }
        std::__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> *)p_Var25);
        cVar28 = (char)(string *)&writer;
        if (ppVar29->second == Write) {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                   ::find(&writeStreamMap._M_t,&streamName);
          if ((_Rb_tree_header *)iVar14._M_node ==
              &writeStreamMap._M_t._M_impl.super__Rb_tree_header) {
            if ((settings.myRank == 0) && (settings.verbose != 0)) {
              poVar10 = std::operator<<((ostream *)&std::cout,"    Create Output Stream ");
              poVar10 = std::operator<<(poVar10,(string *)&streamName);
              poVar10 = std::operator<<(poVar10,"... ");
              std::endl<char,std::char_traits<char>>(poVar10);
            }
            if (settings.outputPath._M_string_length != 0) {
              std::__cxx11::string::string((string *)&writer,(string *)&settings.outputPath);
              if (settings.outputPath._M_dataplus._M_p[settings.outputPath._M_string_length - 1] !=
                  '/') {
                std::__cxx11::string::push_back(cVar28);
              }
              std::operator+(&local_538,(string *)&writer,&streamName);
              std::__cxx11::string::operator=((string *)&streamName,(string *)&local_538);
              std::__cxx11::string::~string((string *)&local_538);
              std::__cxx11::string::~string((string *)&writer);
            }
            std::__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_508,(__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> *)&io);
            openStream((string *)&writer,(shared_ptr<ioGroup> *)&streamName,(Mode)&local_508,1,
                       (MPI_Comm)(ulong)settings.iolib,SUB81(settings.appComm,0),
                       (ulong)settings.ioTimer);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_508._M_refcount)
            ;
            p_Var15 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       ::operator[](&writeStreamMap,&ppVar29->first)->
                       super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>;
LAB_0011530d:
            std::__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (p_Var15,(__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2> *)&writer);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
        }
        else {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                   ::find(&readStreamMap._M_t,&streamName);
          if ((_Rb_tree_header *)iVar14._M_node == &readStreamMap._M_t._M_impl.super__Rb_tree_header
             ) {
            poVar10 = std::operator<<((ostream *)&std::cout,"    Open Input Stream ");
            poVar10 = std::operator<<(poVar10,(string *)&streamName);
            poVar10 = std::operator<<(poVar10,"... ");
            std::endl<char,std::char_traits<char>>(poVar10);
            if (settings.outputPath._M_string_length != 0) {
              std::__cxx11::string::string((string *)&writer,(string *)&settings.outputPath);
              if (settings.outputPath._M_dataplus._M_p[settings.outputPath._M_string_length - 1] !=
                  '/') {
                std::__cxx11::string::push_back(cVar28);
              }
              std::operator+(&local_538,(string *)&writer,&streamName);
              std::__cxx11::string::operator=((string *)&streamName,(string *)&local_538);
              std::__cxx11::string::~string((string *)&local_538);
              std::__cxx11::string::~string((string *)&writer);
            }
            std::__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_518,(__shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2> *)&io);
            openStream((string *)&writer,(shared_ptr<ioGroup> *)&streamName,(Mode)&local_518,2,
                       (MPI_Comm)(ulong)settings.iolib,SUB81(settings.appComm,0),
                       (ulong)settings.ioTimer);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_518._M_refcount)
            ;
            p_Var15 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       ::operator[](&readStreamMap,&ppVar29->first)->
                       super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>;
            goto LAB_0011530d;
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&io.super___shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&streamName);
      }
      local_658 = 1;
      local_668 = 0;
      for (bVar30 = false;
          ppVar7 = streamsInOrder.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, !bVar30;
          bVar30 = bVar30 && cfg.stepOverStreams._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                             0) {
        psVar16 = cfg.commands.
                  super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar6 = cfg.commands.
                 super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (settings.myRank == 0) {
          std::__cxx11::to_string(&local_538,settings.appId);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &writer,"App ",&local_538);
          std::operator+(&streamName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &writer," Step ");
          poVar10 = std::operator<<((ostream *)&std::cout,(string *)&streamName);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,": ");
          std::endl<char,std::char_traits<char>>(poVar10);
          std::__cxx11::string::~string((string *)&streamName);
          std::__cxx11::string::~string((string *)&writer);
          std::__cxx11::string::~string((string *)&local_538);
          psVar16 = cfg.commands.
                    super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar6 = cfg.commands.
                   super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; psVar16 != psVar6; psVar16 = psVar16 + 1) {
          peVar26 = (psVar16->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if ((peVar26->conditionalStream)._M_string_length == 0) {
LAB_0011549e:
            switch(peVar26->op) {
            case Sleep:
              lVar11 = std::chrono::_V2::system_clock::now();
              adios2::ADIOS::EnterComputationBlock();
              peVar26 = (psVar16->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if (peVar26 == (element_type *)0x0) {
                lVar19 = 0;
              }
              else {
                lVar19 = __dynamic_cast(peVar26,&Command::typeinfo,&CommandSleep::typeinfo,0);
              }
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                uVar1 = *(undefined8 *)(lVar19 + 0x30);
                std::operator<<((ostream *)&std::cout,"    Sleep for ");
                auVar31._8_4_ = (int)((ulong)uVar1 >> 0x20);
                auVar31._0_8_ = uVar1;
                auVar31._12_4_ = 0x45300000;
                poVar10 = std::ostream::_M_insert<double>
                                    (((auVar31._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))
                                     / 1000000.0);
                std::operator<<(poVar10,"  seconds ");
              }
              streamName._M_dataplus._M_p = *(pointer *)(lVar19 + 0x30);
              std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                        ((duration<long,_std::ratio<1L,_1000000L>_> *)&streamName);
              adios2::ADIOS::ExitComputationBlock();
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                lVar19 = std::chrono::_V2::system_clock::now();
                std::operator<<((ostream *)&std::cout," -> Slept for ");
                poVar10 = std::ostream::_M_insert<double>((double)(lVar19 - lVar11) / 1000000000.0);
                poVar10 = std::operator<<(poVar10,"  seconds ");
                std::endl<char,std::char_traits<char>>(poVar10);
              }
              break;
            case Busy:
              lVar11 = __dynamic_cast(peVar26,&Command::typeinfo,&CommandBusy::typeinfo,0);
              lVar19 = std::chrono::_V2::system_clock::now();
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                uVar1 = *(undefined8 *)(lVar11 + 0x38);
                poVar10 = std::operator<<((ostream *)&std::cout,"    Busy for ");
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                std::operator<<(poVar10," cycles with ");
                poVar10 = std::ostream::_M_insert<double>
                                    ((((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) -
                                      1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))
                                     / 1000000.0);
                std::operator<<(poVar10," seconds work in each cycle");
              }
              pvVar20 = calloc(0x100000,8);
              pvVar21 = malloc(0x800000);
              for (uVar24 = 0; uVar2 = *(ulong *)(lVar11 + 0x30),
                  lVar22 = std::chrono::_V2::system_clock::now(), uVar24 < uVar2;
                  uVar24 = uVar24 + 1) {
                lVar3 = *(long *)(lVar11 + 0x38);
                if (lVar3 != 0) {
                  adios2::ADIOS::EnterComputationBlock();
                }
                while (lVar23 = std::chrono::_V2::system_clock::now(),
                      lVar23 < lVar3 * 1000 + lVar22) {
                  for (lVar23 = 0; lVar23 != 0x100000; lVar23 = lVar23 + 1) {
                    dVar5 = *(double *)((long)pvVar20 + lVar23 * 8);
                    *(double *)((long)pvVar20 + lVar23 * 8) = dVar5 + dVar5 + 1e-06;
                  }
                }
                if (*(long *)(lVar11 + 0x38) != 0) {
                  adios2::ADIOS::ExitComputationBlock();
                }
                MPI_Allreduce(pvVar20,pvVar21,0x100000,&ompi_mpi_double,&ompi_mpi_op_sum,
                              settings.appComm);
              }
              local_668 = local_668 + (lVar22 - lVar19) / 1000;
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                std::operator<<((ostream *)&std::cout," -> Was busy for ");
                poVar10 = std::ostream::_M_insert<double>((double)(lVar22 - lVar19) / 1000000000.0);
                poVar10 = std::operator<<(poVar10,"  seconds ");
                std::endl<char,std::char_traits<char>>(poVar10);
              }
              break;
            case Write:
              lVar11 = __dynamic_cast(peVar26,&Command::typeinfo,&CommandWrite::typeinfo,0);
              p_Var15 = &std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                         ::operator[](&writeStreamMap,(key_type *)(lVar11 + 0x30))->
                         super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>;
              std::__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2> *)&streamName,p_Var15);
              (**(code **)(*(long *)streamName._M_dataplus._M_p + 0x10))
                        (streamName._M_dataplus._M_p,lVar11,&cfg,&settings,local_658);
              goto LAB_0011594d;
            case Read:
              lVar11 = __dynamic_cast(peVar26,&Command::typeinfo,&CommandRead::typeinfo,0);
              __k = (key_type *)(lVar11 + 0x38);
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                       ::find(&cfg.condMap._M_t,__k);
              if (iVar18._M_node[2]._M_color < 2) {
                p_Var15 = &std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                           ::operator[](&readStreamMap,__k)->
                           super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2> *)&streamName,p_Var15);
                _Var9 = (**(code **)(*(long *)streamName._M_dataplus._M_p + 0x18))
                                  (streamName._M_dataplus._M_p,lVar11,&cfg,&settings,local_658);
                iVar18._M_node[2]._M_color = _Var9;
                if (_Var9 + ~_S_black < 2) {
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  ::erase(&cfg.stepOverStreams._M_t,__k);
                  if (settings.myRank == 0) {
                    pcVar27 = "    Nonblocking read status: Terminated ";
joined_r0x0011593b:
                    if (settings.verbose != 0) {
                      poVar10 = std::operator<<((ostream *)&std::cout,pcVar27);
                      std::endl<char,std::char_traits<char>>(poVar10);
                    }
                  }
                }
                else if ((_Var9 == _S_black) && (settings.myRank == 0)) {
                  pcVar27 = "    Nonblocking read status: Not Ready ";
                  goto joined_r0x0011593b;
                }
LAB_0011594d:
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &streamName._M_string_length);
              }
            }
            if ((settings.myRank == 0) && (settings.verbose != 0)) {
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
          }
          else {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                      ::at(&cfg.condMap,&peVar26->conditionalStream);
            if (*pmVar17 == OK) {
              peVar26 = (psVar16->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              goto LAB_0011549e;
            }
            if ((settings.myRank == 0) && (settings.verbose != 0)) {
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "    Skip command because of status of stream ");
              poVar10 = std::operator<<(poVar10,(string *)
                                                &((psVar16->
                                                  super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->conditionalStream);
              std::endl<char,std::char_traits<char>>(poVar10);
            }
          }
        }
        bVar30 = cfg.nSteps <= local_658;
        local_658 = local_658 + 1;
      }
      for (ppVar29 = streamsInOrder.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar29 != ppVar7;
          ppVar29 = ppVar29 + 1) {
        if (ppVar29->second == Write) {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                           *)&writeStreamMap,&ppVar29->first);
          if ((_Rb_tree_header *)iVar14._M_node !=
              &writeStreamMap._M_t._M_impl.super__Rb_tree_header) {
            p_Var15 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       ::operator[](&writeStreamMap,&ppVar29->first)->
                       super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2> *)&streamName,p_Var15);
            (**(code **)(**(long **)(iVar14._M_node + 2) + 0x20))();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>>
            ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>>
                                *)&writeStreamMap,iVar14);
LAB_00115a89:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&streamName._M_string_length);
          }
        }
        else {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                           *)&readStreamMap,&ppVar29->first);
          if ((_Rb_tree_header *)iVar14._M_node != &readStreamMap._M_t._M_impl.super__Rb_tree_header
             ) {
            p_Var15 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       ::operator[](&readStreamMap,&ppVar29->first)->
                       super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2> *)&streamName,p_Var15);
            (**(code **)(**(long **)(iVar14._M_node + 2) + 0x20))();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>>
            ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>>
                                *)&readStreamMap,iVar14);
            goto LAB_00115a89;
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::~_Rb_tree(&writeStreamMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::~_Rb_tree(&readStreamMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
      ::~_Rb_tree(&ioMap._M_t);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ::~vector(&streamsInOrder);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&groupMap._M_t);
      MPI_Barrier(settings.appComm);
      dVar5 = (double)MPI_Wtime();
      if (settings.myRank == 0) {
        if (local_668 != 0) {
          std::operator<<((ostream *)&std::cout,"  Total Busy time on Rank 0 was ");
          auVar32._0_8_ = (double)CONCAT44(0x43300000,(int)local_668);
          auVar32._8_4_ = (int)((ulong)local_668 >> 0x20);
          auVar32._12_4_ = 0x45300000;
          poVar10 = std::ostream::_M_insert<double>
                              (((auVar32._8_8_ - 1.9342813113834067e+25) +
                               (auVar32._0_8_ - 4503599627370496.0)) / 1000000.0);
          poVar10 = std::operator<<(poVar10," seconds ");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        poVar10 = std::operator<<((ostream *)&std::cout,"ADIOS IOTEST App ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::operator<<(poVar10," total time ");
        poVar10 = std::ostream::_M_insert<double>(dVar5 - dVar4);
        poVar10 = std::operator<<(poVar10," seconds ");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      iVar8 = 0;
      MPI_Finalize();
      Config::~Config(&cfg);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_620);
      goto LAB_00114bb8;
    }
  }
  iVar8 = 1;
LAB_00114bb8:
  Settings::~Settings(&settings);
  return iVar8;
}

Assistant:

int main(int argc, char *argv[])
{
    Settings settings;

    /* Check input arguments. Quit if something is wrong. */
    if (settings.processArguments(argc, argv))
    {
        return 1;
    }

    int provided;
    int threadSupportLevel = MPI_THREAD_SINGLE;
    if (settings.multithreadedMPI)
    {
        threadSupportLevel = MPI_THREAD_MULTIPLE;
    }
    MPI_Init_thread(&argc, &argv, threadSupportLevel, &provided);

    settings.initDecomp(MPI_COMM_WORLD);

    // MPI-dependent argument checks
    if (settings.extraArgumentChecks())
    {
        return 1;
    }

    adios2::ADIOS adios;
    if (settings.adiosConfigFileName.empty())
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Use ADIOS without XML configuration " << std::endl;
        }
        adios = adios2::ADIOS(settings.appComm);
    }
    else
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Use ADIOS xml file " << settings.adiosConfigFileName << std::endl;
        }
        adios = adios2::ADIOS(settings.adiosConfigFileName, settings.appComm);
    }
    Config cfg;
    size_t currentConfigLineNumber = 0;

    try
    {
        cfg = processConfig(settings, &currentConfigLineNumber);
    }
    catch (std::invalid_argument &e) // config file processing errors
    {
        if (!settings.myRank)
        {
            if (!currentConfigLineNumber)
            {
                std::cout << "Config file error: " << e.what() << std::endl;
            }
            else
            {
                std::cout << "Config file error in line " << currentConfigLineNumber << ": "
                          << e.what() << std::endl;
            }
        }

        /* Quit calmly */
        MPI_Finalize();
        return 1;
    }

    double timeStart, timeEnd;
    MPI_Barrier(settings.appComm);
    timeStart = MPI_Wtime();

    uint64_t actualBusyTime_usec = 0;

    try
    {
        /* writing to one stream using two groups is not supported.
         * FIXME: we need to check for this condition and raise error
         */
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Start App " + std::to_string(settings.appId) + ": " << std::endl;
        }
        /* 1. Assign stream names with group names that appear in
           commands */
        // map of <streamName, groupName>
        std::map<std::string, std::string> groupMap;
        // a vector of streams in the order they appear
        std::vector<std::pair<std::string, Operation>> streamsInOrder;
        for (const auto &cmd : cfg.commands)
        {
            if (cmd->op == Operation::Write)
            {
                auto cmdW = dynamic_cast<CommandWrite *>(cmd.get());
                groupMap[cmdW->streamName] = cmdW->groupName;
                streamsInOrder.push_back(std::make_pair(cmdW->streamName, Operation::Write));
            }
            else if (cmd->op == Operation::Read)
            {
                auto cmdR = dynamic_cast<CommandRead *>(cmd.get());
                groupMap[cmdR->streamName] = cmdR->groupName;
                streamsInOrder.push_back(std::make_pair(cmdR->streamName, Operation::Read));
            }
        }

        std::map<std::string, std::shared_ptr<ioGroup>> ioMap;

        /* 2. Declare/define groups and open streams in the order they
         * appear */
        std::map<std::string, std::shared_ptr<Stream>> readStreamMap;
        std::map<std::string, std::shared_ptr<Stream>> writeStreamMap;

        for (const auto &st : streamsInOrder)
        {
            std::string streamName = st.first;
            std::shared_ptr<ioGroup> io;
            auto &groupName = groupMap[streamName];
            auto it = ioMap.find(groupName);
            if (it == ioMap.end())
            {
                io = createGroup(groupName, settings.iolib, adios);
                ioMap[groupName] = io;
            }
            else
            {
                io = it->second;
            }
            const bool isWrite = (st.second == Operation::Write);
            if (isWrite)
            {
                auto it = writeStreamMap.find(streamName);
                if (it == writeStreamMap.end())
                {
                    if (!settings.myRank && settings.verbose)
                    {
                        std::cout << "    Create Output Stream " << streamName << "... "
                                  << std::endl;
                    }
                    if (!settings.outputPath.empty())
                    {
                        std::string outputPath = settings.outputPath;
                        if (settings.outputPath.back() != '/')
                        {
                            outputPath += '/';
                        }

                        streamName = outputPath + streamName;
                    }
                    std::shared_ptr<Stream> writer =
                        openStream(streamName, io, adios2::Mode::Write, settings.iolib,
                                   settings.appComm, settings.ioTimer, settings.appId);
                    writeStreamMap[st.first] = writer;
                }
            }
            else /* Read */
            {
                auto it = readStreamMap.find(streamName);
                if (it == readStreamMap.end())
                {
                    std::cout << "    Open Input Stream " << streamName << "... " << std::endl;
                    if (!settings.outputPath.empty())
                    {
                        std::string outputPath = settings.outputPath;
                        if (settings.outputPath.back() != '/')
                        {
                            outputPath += '/';
                        }

                        streamName = outputPath + streamName;
                    }
                    std::shared_ptr<Stream> reader =
                        openStream(streamName, io, adios2::Mode::Read, settings.iolib,
                                   settings.appComm, settings.ioTimer, settings.appId);
                    readStreamMap[st.first] = reader;
                }
            }
        }

        /* Execute commands */
        bool exitLoop = false;
        size_t step = 1;
        while (!exitLoop)
        {
            if (!settings.myRank)
            {
                std::cout << "App " + std::to_string(settings.appId) + " Step " << step << ": "
                          << std::endl;
            }
            for (const auto &cmd : cfg.commands)
            {
                if (!cmd->conditionalStream.empty() &&
                    cfg.condMap.at(cmd->conditionalStream) != adios2::StepStatus::OK)
                {
                    if (!settings.myRank && settings.verbose)
                    {
                        std::cout << "    Skip command because of status "
                                     "of stream "
                                  << cmd->conditionalStream << std::endl;
                    }
                    continue;
                }

                switch (cmd->op)
                {
                case Operation::Sleep: {
                    std::chrono::high_resolution_clock::time_point start =
                        std::chrono::high_resolution_clock::now();
                    adios.EnterComputationBlock();
                    auto cmdS = dynamic_cast<const CommandSleep *>(cmd.get());
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>(cmdS->sleepTime_us) / 1000000.0;
                        std::cout << "    Sleep for " << t << "  seconds ";
                    }
                    std::this_thread::sleep_for(std::chrono::microseconds(cmdS->sleepTime_us));
                    adios.ExitComputationBlock();
                    if (!settings.myRank && settings.verbose)
                    {
                        std::chrono::high_resolution_clock::time_point end =
                            std::chrono::high_resolution_clock::now();
                        double t = static_cast<double>((end - start).count()) / 1000000000.0;
                        std::cout << " -> Slept for " << t << "  seconds " << std::endl;
                    }
                    break;
                }
                case Operation::Busy: {
                    auto cmdS = dynamic_cast<const CommandBusy *>(cmd.get());
                    std::chrono::high_resolution_clock::time_point start =
                        std::chrono::high_resolution_clock::now();
                    // auto sleeptime =
                    //     std::chrono::microseconds(cmdS->busyTime_us);
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>(cmdS->busyTime_us) / 1000000.0;
                        std::cout << "    Busy for " << cmdS->cycles << " cycles with " << t
                                  << " seconds work in each cycle";
                    }
                    const size_t N = 1048576;
                    double *f = (double *)calloc(N, sizeof(double));
                    double *g = (double *)malloc(N * sizeof(double));
                    for (size_t c = 0; c < cmdS->cycles; ++c)
                    {
                        auto end = std::chrono::high_resolution_clock::now() +
                                   std::chrono::microseconds(cmdS->busyTime_us);
                        if (cmdS->busyTime_us > 0.1)
                        {
                            adios.EnterComputationBlock();
                        }
                        while (std::chrono::high_resolution_clock::now() < end)
                        {
                            for (size_t i = 0; i < N; ++i)
                            {
                                f[i] = f[i] * 2.0 + 0.000001;
                            }
                        }
                        if (cmdS->busyTime_us > 0.1)
                        {
                            adios.ExitComputationBlock();
                        }
                        MPI_Allreduce(f, g, N, MPI_DOUBLE, MPI_SUM, settings.appComm);
                    }
                    std::chrono::high_resolution_clock::time_point end =
                        std::chrono::high_resolution_clock::now();
                    actualBusyTime_usec += (end - start).count() / 1000;
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>((end - start).count()) / 1000000000.0;
                        std::cout << " -> Was busy for " << t << "  seconds " << std::endl;
                    }
                    break;
                }
                case Operation::Write: {
                    auto cmdW = dynamic_cast<CommandWrite *>(cmd.get());
                    auto stream = writeStreamMap[cmdW->streamName];
                    // auto io = ioMap[cmdW->groupName];
                    stream->Write(cmdW, cfg, settings, step);
                    break;
                }
                case Operation::Read: {
                    auto cmdR = dynamic_cast<CommandRead *>(cmd.get());
                    auto statusIt = cfg.condMap.find(cmdR->streamName);
                    if (statusIt->second == adios2::StepStatus::OK ||
                        statusIt->second == adios2::StepStatus::NotReady)
                    {
                        auto stream = readStreamMap[cmdR->streamName];
                        // auto io = ioMap[cmdR->groupName];
                        adios2::StepStatus status = stream->Read(cmdR, cfg, settings, step);
                        statusIt->second = status;
                        switch (status)
                        {
                        case adios2::StepStatus::OK:
                            break;
                        case adios2::StepStatus::NotReady:
                            if (!settings.myRank && settings.verbose)
                            {
                                std::cout << "    Nonblocking read status: "
                                             "Not Ready "
                                          << std::endl;
                            }
                            break;
                        case adios2::StepStatus::EndOfStream:
                        case adios2::StepStatus::OtherError:
                            cfg.stepOverStreams.erase(cmdR->streamName);
                            if (!settings.myRank && settings.verbose)
                            {
                                std::cout << "    Nonblocking read status: "
                                             "Terminated "
                                          << std::endl;
                            }
                            break;
                        }
                    }
                    break;
                }
                }
                if (!settings.myRank && settings.verbose)
                {
                    std::cout << std::endl;
                }
            }
            if (!cfg.stepOverStreams.size() && step >= cfg.nSteps)
            {
                exitLoop = true;
            }
            ++step;
        }

        /* Close all streams in order of opening */
        for (const auto &st : streamsInOrder)
        {
            const std::string &streamName = st.first;
            const bool isWrite = (st.second == Operation::Write);
            if (isWrite)
            {
                auto writerIt = writeStreamMap.find(streamName);
                if (writerIt != writeStreamMap.end())
                {
                    auto writer = writeStreamMap[streamName];
                    writerIt->second->Close();
                    writeStreamMap.erase(writerIt);
                }
            }
            else /* Read */
            {
                auto readerIt = readStreamMap.find(streamName);
                if (readerIt != readStreamMap.end())
                {
                    auto reader = readStreamMap[streamName];
                    readerIt->second->Close();
                    readStreamMap.erase(readerIt);
                }
            }
        }
    }
    catch (std::exception &e) // if some unknown error occurs
    {
        if (!settings.myRank)
        {
            std::cout << "ADIOS " << e.what() << std::endl;
        }

        /* Yell and quit */
        MPI_Abort(settings.appComm, -1);
    }

    MPI_Barrier(settings.appComm);
    timeEnd = MPI_Wtime();
    if (!settings.myRank)
    {
        if (actualBusyTime_usec > 0)
        {
            std::cout << "  Total Busy time on Rank 0 was "
                      << (double)actualBusyTime_usec / 1000000.0 << " seconds " << std::endl;
        }
        std::cout << "ADIOS IOTEST App " << settings.appId << " total time " << timeEnd - timeStart
                  << " seconds " << std::endl;
    }

    MPI_Finalize();
    return 0;
}